

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.cpp
# Opt level: O3

int despot::Variable::ComputeCurrentIndex
              (vector<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_> *vars)

{
  pointer ppNVar1;
  NamedVar *pNVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  
  ppNVar1 = (vars->super__Vector_base<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_>).
            _M_impl.super__Vector_impl_data._M_start;
  lVar4 = (long)(vars->super__Vector_base<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_>).
                _M_impl.super__Vector_impl_data._M_finish - (long)ppNVar1;
  if (lVar4 != 0) {
    lVar4 = lVar4 >> 3;
    lVar5 = 0;
    iVar3 = 0;
    do {
      pNVar2 = ppNVar1[lVar5];
      iVar3 = (int)((ulong)((long)*(pointer *)
                                   ((long)&(pNVar2->super_Variable).values_.
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   + 8) -
                           *(long *)&(pNVar2->super_Variable).values_.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data) >> 5) * iVar3 +
              (pNVar2->super_Variable).curr_value;
      lVar5 = lVar5 + 1;
    } while (lVar4 + (ulong)(lVar4 == 0) != lVar5);
    return iVar3;
  }
  return 0;
}

Assistant:

int Variable::ComputeCurrentIndex(const vector<NamedVar*>& vars) {
	int index = 0;
	for (int i = 0; i < vars.size(); i++) {
		NamedVar* var = vars[i];
		index = index * var->Size() + var->curr_value;
	}
	return index;
}